

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBasisToolsBspline.h
# Opt level: O2

void chrono::geometry::ChBasisToolsBspline::BasisEvaluateDeriv
               (int p,int i,double u,ChVectorDynamic<> *knotU,ChMatrixDynamic<> *DN)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Scalar SVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  double *pdVar11;
  void *pvVar12;
  Scalar *pSVar13;
  CoeffReturnType pdVar14;
  uint uVar15;
  double *pdVar16;
  long lVar17;
  int iVar18;
  double *pdVar19;
  ulong row;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long col;
  long col_00;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double local_110;
  double local_f8;
  long local_f0;
  ulong local_d0;
  long local_c0;
  ChMatrixDynamic<> a;
  ChMatrixDynamic<> ndu;
  uint local_5c;
  long local_58;
  long local_50;
  long local_48;
  Index local_40;
  uint local_34;
  
  iVar18 = (int)(DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                m_rows;
  uVar15 = p + 1;
  uVar21 = (ulong)uVar15 * 8;
  if (p < -1) {
    uVar21 = 0xffffffffffffffff;
  }
  local_58 = -1;
  pdVar11 = (double *)operator_new__(uVar21);
  pvVar12 = operator_new__(uVar21);
  a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data._0_4_ = uVar15
  ;
  local_5c = uVar15;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&ndu,(int *)&a,(int *)&local_5c);
  local_5c = uVar15;
  local_34 = uVar15;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&a,(int *)&local_5c,(int *)&local_34);
  pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&ndu,0,0);
  *pSVar13 = 1.0;
  pdVar16 = pdVar11;
  for (uVar21 = 1; pdVar16 = pdVar16 + 1, uVar21 != (~(p >> 0x1f) & p) + 1; uVar21 = uVar21 + 1) {
    pdVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)knotU,
                         (long)((i + 1) - (int)uVar21));
    pdVar11[uVar21] = u - *pdVar14;
    pdVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)knotU,
                         uVar21 + (long)i);
    uVar20 = 0;
    *(double *)((long)pvVar12 + uVar21 * 8) = *pdVar14 - u;
    local_f8 = 0.0;
    pdVar19 = pdVar16;
    while (uVar21 != uVar20) {
      dVar1 = *pdVar19;
      dVar2 = *(double *)((long)pvVar12 + uVar20 * 8 + 8);
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&ndu,
                           uVar21,uVar20);
      *pSVar13 = dVar2 + dVar1;
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&ndu,
                           uVar20,uVar21 - 1);
      dVar3 = *pSVar13;
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&ndu,
                           uVar21,uVar20);
      dVar4 = *pSVar13;
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&ndu,
                           uVar20,uVar21);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar2;
      pdVar19 = pdVar19 + -1;
      uVar20 = uVar20 + 1;
      auVar24._0_8_ = dVar3 / dVar4;
      auVar24._8_8_ = 0;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_f8;
      auVar23 = vfmadd213sd_fma(auVar27,auVar24,auVar6);
      local_f8 = auVar24._0_8_ * dVar1;
      *pSVar13 = auVar23._0_8_;
    }
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&ndu,uVar21
                         ,uVar21);
    *pSVar13 = local_f8;
  }
  col = (long)p;
  for (lVar17 = 0; lVar17 <= col; lVar17 = lVar17 + 1) {
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&ndu,lVar17
                         ,col);
    SVar5 = *pSVar13;
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)DN,0,lVar17
                        );
    *pSVar13 = SVar5;
  }
  if (iVar18 != 1) {
    local_50 = (long)iVar18;
    for (uVar21 = 0; (long)uVar21 <= col; uVar21 = uVar21 + 1) {
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&a,0,0);
      *pSVar13 = 1.0;
      local_48 = uVar21 - 1;
      local_c0 = local_58;
      local_d0 = 1;
      uVar15 = 0;
      for (uVar20 = 1; (long)uVar20 < local_50; uVar20 = uVar20 + 1) {
        lVar17 = col - uVar20;
        lVar22 = uVar21 - uVar20;
        row = (ulong)uVar15;
        if (uVar21 < uVar20) {
          local_110 = 0.0;
        }
        else {
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&a,
                               row,0);
          dVar1 = *pSVar13;
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&ndu,
                               lVar17 + 1,lVar22);
          dVar2 = *pSVar13;
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&a,
                               local_d0,0);
          *pSVar13 = dVar1 / dVar2;
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&a,
                               local_d0,0);
          local_110 = *pSVar13;
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&ndu,
                               lVar22,lVar17);
          local_110 = local_110 * *pSVar13;
        }
        local_f0 = lVar17 + 1;
        local_40 = uVar20 - 1;
        iVar18 = (int)local_40;
        if (lVar17 < local_48) {
          iVar18 = p - (int)uVar21;
        }
        col_00 = (long)-(int)lVar22;
        if (-2 < lVar22) {
          col_00 = 1;
        }
        while (col_00 <= iVar18) {
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&a,
                               row,col_00);
          dVar1 = *pSVar13;
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&a,
                               row,col_00 + -1);
          dVar2 = *pSVar13;
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&ndu,
                               local_f0,col_00 + local_c0);
          dVar3 = *pSVar13;
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&a,
                               local_d0,col_00);
          *pSVar13 = (dVar1 - dVar2) / dVar3;
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&a,
                               local_d0,col_00);
          SVar5 = *pSVar13;
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&ndu,
                               col_00 + local_c0,lVar17);
          auVar25._8_8_ = 0;
          auVar25._0_8_ = local_110;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = SVar5;
          col_00 = col_00 + 1;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *pSVar13;
          auVar23 = vfmadd231sd_fma(auVar25,auVar28,auVar7);
          local_110 = auVar23._0_8_;
        }
        if ((long)uVar21 <= lVar17) {
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&a,
                               row,local_40);
          SVar5 = *pSVar13;
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&ndu,
                               local_f0,uVar21);
          dVar1 = *pSVar13;
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&a,
                               local_d0,uVar20);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = SVar5;
          auVar8._8_8_ = 0x8000000000000000;
          auVar8._0_8_ = 0x8000000000000000;
          auVar23 = vxorpd_avx512vl(auVar9,auVar8);
          *pSVar13 = auVar23._0_8_ / dVar1;
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&a,
                               local_d0,uVar20);
          SVar5 = *pSVar13;
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&ndu,
                               uVar21,lVar17);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = local_110;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = SVar5;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = *pSVar13;
          auVar23 = vfmadd231sd_fma(auVar26,auVar29,auVar23);
          local_110 = auVar23._0_8_;
        }
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)DN,
                             uVar20,uVar21);
        local_c0 = local_c0 + -1;
        *pSVar13 = local_110;
        uVar10 = (uint)local_d0;
        local_d0 = (ulong)uVar15;
        uVar15 = uVar10;
      }
      local_58 = local_58 + 1;
    }
    iVar18 = p;
    for (lVar17 = 1; lVar17 < local_50; lVar17 = lVar17 + 1) {
      for (lVar22 = 0; lVar22 <= col; lVar22 = lVar22 + 1) {
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)DN,
                             lVar17,lVar22);
        *pSVar13 = (double)iVar18 * *pSVar13;
      }
      iVar18 = iVar18 * (p - (int)lVar17);
    }
    operator_delete__(pdVar11);
    operator_delete__(pvVar12);
  }
  Eigen::internal::handmade_aligned_free
            ((void *)CONCAT44(a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data._4_4_,
                              (uint)a.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                    .m_storage.m_data));
  Eigen::internal::handmade_aligned_free
            (ndu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

static void BasisEvaluateDeriv(const int p,     ///< order of spline
                                   const int i,     ///< knot span, assume aready computed via FindSpan()
                                   const double u,  ///< parameter
                                   const ChVectorDynamic<>& knotU,  ///< knot vector
                                   ChMatrixDynamic<>& DN  ///< here return derivatives evaluated at u, that is: dN/du(u)
    ) {
        int order = (int)DN.rows() - 1;  // max order of derivatives (0th in row 0 of DN, 1st in row 1 of DN, etc.)
        double saved, temp;
        int j, k, j1, j2, r;

        double* left = new double[p + 1];
        double* right = new double[p + 1];

        ChMatrixDynamic<> ndu(p + 1, p + 1);
        ChMatrixDynamic<> a(p + 1, p + 1);

        ndu(0, 0) = 1.;
        for (j = 1; j <= p; j++) {
            left[j] = u - knotU(i + 1 - j);
            right[j] = knotU(i + j) - u;
            saved = 0.0;
            for (r = 0; r < j; r++) {
                ndu(j, r) = right[r + 1] + left[j - r];
                temp = ndu(r, j - 1) / ndu(j, r);

                ndu(r, j) = saved + right[r + 1] * temp;
                saved = left[j - r] * temp;
            }
            ndu(j, j) = saved;
        }
        for (j = 0; j <= p; j++)
            DN(0, j) = ndu(j, p);

        if (order == 0)
            return;

        for (r = 0; r <= p; r++) {
            int s1 = 0, s2 = 1;
            a(0, 0) = 1.0;

            for (k = 1; k <= order; k++) {
                double d = 0.;
                int rk = r - k, pk = p - k;
                if (r >= k) {
                    a(s2, 0) = a(s1, 0) / ndu(pk + 1, rk);
                    d = a(s2, 0) * ndu(rk, pk);
                }
                j1 = rk >= -1 ? 1 : -rk;
                j2 = (r - 1 <= pk) ? k - 1 : p - r;
                for (j = j1; j <= j2; j++) {
                    a(s2, j) = (a(s1, j) - a(s1, j - 1)) / ndu(pk + 1, rk + j);
                    d += a(s2, j) * ndu(rk + j, pk);
                }
                if (r <= pk) {
                    a(s2, k) = -a(s1, k - 1) / ndu(pk + 1, r);
                    d += a(s2, k) * ndu(r, pk);
                }
                DN(k, r) = d;
                j = s1;
                s1 = s2;
                s2 = j;
            }
        }
        r = p;
        for (k = 1; k <= order; k++) {
            for (j = 0; j <= p; j++)
                DN(k, j) *= r;
            r *= (p - k);
        }

        delete[] left;
        delete[] right;
    }